

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void __thiscall
TreePropagator::DFSPink
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *visited,
          vector<bool,_std::allocator<bool>_> *blue,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *badEdges)

{
  pointer pvVar1;
  long lVar2;
  int *piVar3;
  BoolView *pBVar4;
  bool bVar5;
  size_type __n;
  int r_00;
  uint uVar6;
  reference rVar7;
  int e;
  uint local_44;
  _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_40;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  __n = (size_type)r;
  local_40 = (_Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)badEdges;
  local_38 = visited;
  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](visited,__n);
  *rVar7._M_p = *rVar7._M_p | rVar7._M_mask;
  uVar6 = 0;
  do {
    pvVar1 = (this->super_GraphPropagator).adj.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar2 = *(long *)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar1[__n].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar2 >> 2) <= (ulong)uVar6) {
      return;
    }
    local_44 = *(uint *)(lVar2 + (ulong)uVar6 * 4);
    piVar3 = (this->super_GraphPropagator).endnodes.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)local_44].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    r_00 = *piVar3;
    if (r_00 == r) {
      r_00 = piVar3[1];
    }
    pBVar4 = (this->super_GraphPropagator).es.data;
    if (sat.assigns.data[(uint)pBVar4[local_44].v] == '\0') {
LAB_0015be2f:
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](blue,(long)r_00);
      if ((*rVar7._M_p & rVar7._M_mask) == 0) {
LAB_0015be42:
        rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](local_38,(long)r_00);
        if ((*rVar7._M_p & rVar7._M_mask) == 0) {
          DFSPink(this,r_00,local_38,blue,
                  (unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                  local_40);
        }
      }
    }
    else {
      bVar5 = BoolView::isFalse(pBVar4 + local_44);
      if (!bVar5) goto LAB_0015be2f;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[](blue,(long)r_00);
      if ((*rVar7._M_p & rVar7._M_mask) == 0) goto LAB_0015be42;
      std::__detail::
      _Insert_base<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert(local_40,(value_type *)&local_44);
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void TreePropagator::DFSPink(int r, std::vector<bool>& visited, std::vector<bool>& blue,
														 std::unordered_set<edge_id>& badEdges) {
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			if (blue[other]) {
				badEdges.insert(e);
				continue;
			}
		} else if (blue[other]) {
			continue;
		}
		if (visited[other] == false) {
			DFSPink(other, visited, blue, badEdges);
		}
	}
}